

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O3

IPAddress * jaegertracing::net::IPAddress::v4(IPAddress *__return_storage_ptr__,string *hostPort)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> result;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_38;
  
  parse(&local_38,hostPort);
  jaegertracing::net::IPAddress::versionFromString
            ((string *)__return_storage_ptr__,(int)&local_38,local_38.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.first._M_dataplus._M_p != &local_38.first.field_2) {
    operator_delete(local_38.first._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static IPAddress v4(const std::string& hostPort)
    {
        auto result = parse(hostPort);
        return v4(result.first, result.second);
    }